

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O3

mraa_result_t mraa_intel_edison_misc_spi(void)

{
  uint pin;
  mraa_result_t mVar1;
  mraa_result_t mVar2;
  mraa_result_t extraout_EAX;
  mraa_gpio_context dev;
  mraa_result_t res;
  long lVar3;
  
  mVar1 = mraa_gpio_write(tristate,0);
  if (mVar1 == MRAA_SUCCESS) {
    lVar3 = 0;
    do {
      pin = *(uint *)((long)mraa_intel_edison_misc_spi::gpio_pin_list + lVar3);
      dev = mraa_gpio_init_raw(pin);
      if (dev == (mraa_gpio_context)0x0) {
        syslog(3,"edison: Failed to init raw gpio %d!",(ulong)pin);
        return extraout_EAX;
      }
      mVar1 = mraa_gpio_dir(dev,MRAA_GPIO_OUT);
      if (mVar1 != MRAA_SUCCESS) {
        mVar1 = mraa_gpio_close(dev);
        return mVar1;
      }
      mVar1 = mraa_gpio_write(dev,*(int *)((long)mraa_intel_edison_misc_spi::gpio_val_list + lVar3))
      ;
      mVar2 = mraa_gpio_close(dev);
      if (mVar1 != MRAA_SUCCESS) {
        return mVar2;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x18);
    mVar1 = mraa_intel_edison_pinmode_change(0x73,1);
    if (((mVar1 == MRAA_SUCCESS) &&
        (mVar1 = mraa_intel_edison_pinmode_change(0x72,1), mVar1 == MRAA_SUCCESS)) &&
       (mVar1 = mraa_intel_edison_pinmode_change(0x6d,1), mVar1 == MRAA_SUCCESS)) {
      mVar1 = mraa_gpio_write(tristate,1);
      return mVar1;
    }
  }
  return mVar1;
}

Assistant:

static mraa_result_t
mraa_intel_edison_misc_spi()
{
    // These arrays must have same length
    static const int gpio_pin_list[] = {263, 240, 262, 241, 242, 243};
    static int pin_num = sizeof(gpio_pin_list) / sizeof(int);
    static const int gpio_val_list[] = {1, 0, 1, 0, 0, 0};
    static const int gpio_dir_list[] = {MRAA_GPIO_OUT, MRAA_GPIO_OUT,
                                        MRAA_GPIO_OUT, MRAA_GPIO_OUT,
                                        MRAA_GPIO_OUT, MRAA_GPIO_OUT};
    int i;
    mraa_result_t ret;

    MRAA_RETURN_FOR_ERROR(mraa_gpio_write(tristate, 0));

    for (i = 0; i < pin_num; i++) {
        mraa_gpio_context io = mraa_gpio_init_raw(gpio_pin_list[i]);
        if (io != NULL) {
            ret = mraa_gpio_dir(io, gpio_dir_list[i]);
            if (ret == MRAA_SUCCESS) {
                ret = mraa_gpio_write(io, gpio_val_list[i]);
            }

            //Don't care return value of close()
            mraa_gpio_close(io);
            MRAA_RETURN_FOR_ERROR(ret);
        } else {
          syslog(LOG_ERR, "edison: Failed to init raw gpio %d!",gpio_pin_list[i]);
          return MRAA_ERROR_NO_RESOURCES;
        }
    }

    MRAA_RETURN_FOR_ERROR(mraa_intel_edison_pinmode_change(115, 1));
    MRAA_RETURN_FOR_ERROR(mraa_intel_edison_pinmode_change(114, 1));
    MRAA_RETURN_FOR_ERROR(mraa_intel_edison_pinmode_change(109, 1));
    MRAA_RETURN_FOR_ERROR(mraa_gpio_write(tristate, 1));

    return MRAA_SUCCESS;
}